

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O0

void __thiscall encoder_Hx_basic_demo_Test::TestBody(encoder_Hx_basic_demo_Test *this)

{
  uint32_t uVar1;
  ostream *this_00;
  void *this_01;
  vector<bool,_std::allocator<bool>_> local_2038;
  undefined1 local_2010 [8];
  array<bool,_2048UL> output;
  array<bool,_6144UL> input;
  encoder_Hx_basic_demo_Test *this_local;
  
  memset(output._M_elems + 0x7f8,0,0x1800);
  memset(local_2010,0,0x800);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  std::operator<<((ostream *)&std::cout,"Input nonzeros:\n");
  HelpersForTests::get_bitstring<bool>(&local_2038,0x1800);
  HelpersForTests::vec_to_arr<bool,6144ul>
            (&local_2038,(array<bool,_6144UL> *)(output._M_elems + 0x7f8));
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_2038);
  HelpersForTests::print_nz_inds<std::array<bool,6144ul>>
            ((array<bool,_6144UL> *)(output._M_elems + 0x7f8));
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  LDPC4QKD::encode<bool>
            ((array<bool,_6144UL> *)(output._M_elems + 0x7f8),(array<bool,_2048UL> *)local_2010);
  std::operator<<((ostream *)&std::cout,"Syndrome nonzeros:\n");
  HelpersForTests::print_nz_inds<std::array<bool,2048ul>>((array<bool,_2048UL> *)local_2010);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  this_00 = std::operator<<((ostream *)&std::cout,"Syndrome hash: ");
  uVar1 = HelpersForTests::hash_vector<std::array<bool,2048ul>>((array<bool,_2048UL> *)local_2010);
  this_01 = (void *)std::ostream::operator<<(this_00,uVar1);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

TEST(encoder, Hx_basic_demo) {
    std::array<Bit, AutogenLDPC::N> input{};
    std::array<Bit, AutogenLDPC::M> output{};

    std::cout << "------------------------\n";
    std::cout << "Input nonzeros:\n";
    vec_to_arr<Bit, AutogenLDPC::N>(get_bitstring(AutogenLDPC::N), input);
    // noise_bitstring_inplace(input, 0.5, seed);

    print_nz_inds(input);

    std::cout << "------------------------\n";

    encode(input, output);

    std::cout << "Syndrome nonzeros:\n";
    print_nz_inds(output);

    std::cout << "------------------------\n";

    std::cout << "Syndrome hash: " << hash_vector(output) << std::endl;
}